

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

bool __thiscall Clasp::Asp::LogicProgram::propagate(LogicProgram *this,bool backprop)

{
  uint uVar1;
  PrgNode PVar2;
  bool bVar3;
  uint uVar4;
  PrgAtom *pPVar5;
  byte bVar6;
  Literal x;
  ulong uVar7;
  
  uVar1 = *(uint *)&(this->opts_).field_0x4;
  uVar4 = uVar1 & 0xdfffffff;
  *(uint *)&(this->opts_).field_0x4 = (uint)backprop << 0x1d | uVar4;
  if ((this->propQ_).ebo_.size != 0) {
    uVar7 = 0;
    do {
      pPVar5 = (this->atoms_).ebo_.buf[(this->propQ_).ebo_.buf[uVar7]];
      if (((pPVar5->super_PrgHead).super_PrgNode.field_0x7 & 0x40) == 0) {
        bVar3 = PrgAtom::propagateValue(pPVar5,this,backprop);
        if (!bVar3) {
LAB_001403c6:
          pPVar5 = getTrueAtom(this);
          (pPVar5->super_PrgHead).super_PrgNode =
               (PrgNode)(((ulong)(pPVar5->super_PrgHead).super_PrgNode & 0xffffffff80000000) + 1);
          return false;
        }
        PVar2 = (pPVar5->super_PrgHead).super_PrgNode;
        if (((PVar2._0_4_ & 0x7fffffff) != 1) && ((PVar2._4_4_ & 0xfffffff) < (this->input_).lo)) {
          bVar6 = PVar2._7_1_ >> 4 & 3;
          x.rep_ = ((uint)(bVar6 == 2) ^ PVar2._0_4_) * 2;
          if (bVar6 == 0) {
            x.rep_ = 0;
          }
          bVar3 = SharedContext::addUnary((this->super_ProgramBuilder).ctx_,x);
          if (!bVar3) goto LAB_001403c6;
        }
      }
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
    } while (uVar4 != (this->propQ_).ebo_.size);
    uVar4 = *(uint *)&(this->opts_).field_0x4 & 0xdfffffff;
  }
  *(uint *)&(this->opts_).field_0x4 = uVar1 & 0x20000000 | uVar4;
  (this->propQ_).ebo_.size = 0;
  return true;
}

Assistant:

bool LogicProgram::propagate(bool backprop) {
	assert(frozen());
	bool oldB = opts_.backprop != 0;
	opts_.backprop = backprop;
	for (VarVec::size_type i = 0; i != propQ_.size(); ++i) {
		PrgAtom* a = getAtom(propQ_[i]);
		if (!a->relevant()) { continue; }
		if (!a->propagateValue(*this, backprop)) {
			setConflict();
			return false;
		}
		if (a->hasVar() && a->id() < startAtom() && !ctx()->addUnary(a->trueLit())) {
			setConflict();
			return false;
		}
	}
	opts_.backprop = oldB;
	propQ_.clear();
	return true;
}